

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O0

BrotliEncoderStateInternal *
duckdb_brotli::BrotliEncoderCreateInstance
          (brotli_alloc_func alloc_func,brotli_free_func free_func,void *opaque)

{
  brotli_alloc_func in_RDX;
  brotli_free_func in_RSI;
  brotli_alloc_func in_RDI;
  BrotliEncoderStateInternal *state;
  brotli_free_func in_stack_ffffffffffffffd8;
  BrotliEncoderStateInternal *local_8;
  
  local_8 = (BrotliEncoderStateInternal *)
            BrotliBootstrapAlloc((size_t)in_RSI,in_RDX,in_stack_ffffffffffffffd8,(void *)0x78321c);
  if (local_8 == (BrotliEncoderStateInternal *)0x0) {
    local_8 = (BrotliEncoderStateInternal *)0x0;
  }
  else {
    BrotliInitMemoryManager(&local_8->memory_manager_,in_RDI,in_RSI,in_RDX);
    BrotliEncoderInitState((BrotliEncoderStateInternal *)0x78325a);
  }
  return local_8;
}

Assistant:

BrotliEncoderState* duckdb_brotli::BrotliEncoderCreateInstance(
    brotli_alloc_func alloc_func, brotli_free_func free_func, void* opaque) {
  BrotliEncoderState* state = (BrotliEncoderState*)BrotliBootstrapAlloc(
      sizeof(BrotliEncoderState), alloc_func, free_func, opaque);
  if (state == NULL) {
    /* BROTLI_DUMP(); */
    return 0;
  }
  BrotliInitMemoryManager(
      &state->memory_manager_, alloc_func, free_func, opaque);
  BrotliEncoderInitState(state);
  return state;
}